

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int make_fflags_entry(archive_write *a,xml_writer *writer,char *element,char *fflags_text)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *local_78;
  char *cp;
  int local_68;
  int r;
  int n;
  int i;
  char *p;
  flagentry *avail [2];
  flagentry *local_40;
  flagentry *flagentry;
  flagentry *fe;
  char *fflags_text_local;
  char *element_local;
  xml_writer *writer_local;
  archive_write *a_local;
  
  iVar1 = strcmp(element,"ext2");
  if (iVar1 == 0) {
    local_40 = make_fflags_entry::flagext2;
  }
  else {
    local_40 = make_fflags_entry::flagbsd;
  }
  local_68 = 0;
  _n = fflags_text;
  do {
    local_78 = strchr(_n,0x2c);
    if (local_78 == (char *)0x0) {
      sVar3 = strlen(_n);
      local_78 = _n + sVar3;
    }
    for (flagentry = local_40; flagentry->name != (char *)0x0; flagentry = flagentry + 1) {
      if (((local_78[(long)flagentry->name - (long)_n] == '\0') && (*_n == *flagentry->name)) &&
         (iVar1 = strncmp(_n,flagentry->name,(long)local_78 - (long)_n), iVar1 == 0)) {
        avail[(long)local_68 + -1] = flagentry;
        local_68 = local_68 + 1;
        break;
      }
    }
    if (*local_78 == ',') {
      _n = local_78 + 1;
    }
    else {
      _n = (char *)0x0;
    }
    if (_n == (char *)0x0) {
      if (0 < local_68) {
        uVar2 = xml_writer_start_element(writer,element);
        if ((int)uVar2 < 0) {
          archive_set_error(&a->archive,-1,"xml_writer_start_element() failed: %d",(ulong)uVar2);
          return -0x1e;
        }
        for (r = 0; r < local_68; r = r + 1) {
          iVar1 = xmlwrite_string(a,writer,avail[(long)r + -1]->xarname,(char *)0x0);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        uVar2 = xml_writer_end_element(writer);
        if ((int)uVar2 < 0) {
          archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",(ulong)uVar2);
          return -0x1e;
        }
      }
      return 0;
    }
  } while( true );
}

Assistant:

static int
make_fflags_entry(struct archive_write *a, struct xml_writer *writer,
    const char *element, const char *fflags_text)
{
	static const struct flagentry {
		const char	*name;
		const char	*xarname;
	}
	flagbsd[] = {
		{ "sappnd",	"SystemAppend"},
		{ "sappend",	"SystemAppend"},
		{ "arch",	"SystemArchived"},
		{ "archived",	"SystemArchived"},
		{ "schg",	"SystemImmutable"},
		{ "schange",	"SystemImmutable"},
		{ "simmutable",	"SystemImmutable"},
		{ "nosunlnk",	"SystemNoUnlink"},
		{ "nosunlink",	"SystemNoUnlink"},
		{ "snapshot",	"SystemSnapshot"},
		{ "uappnd",	"UserAppend"},
		{ "uappend",	"UserAppend"},
		{ "uchg",	"UserImmutable"},
		{ "uchange",	"UserImmutable"},
		{ "uimmutable",	"UserImmutable"},
		{ "nodump",	"UserNoDump"},
		{ "noopaque",	"UserOpaque"},
		{ "nouunlnk",	"UserNoUnlink"},
		{ "nouunlink",	"UserNoUnlink"},
		{ NULL, NULL}
	},
	flagext2[] = {
		{ "sappnd",	"AppendOnly"},
		{ "sappend",	"AppendOnly"},
		{ "schg",	"Immutable"},
		{ "schange",	"Immutable"},
		{ "simmutable",	"Immutable"},
		{ "nodump",	"NoDump"},
		{ "nouunlnk",	"Undelete"},
		{ "nouunlink",	"Undelete"},
		{ "btree",	"BTree"},
		{ "comperr",	"CompError"},
		{ "compress",	"Compress"},
		{ "noatime",	"NoAtime"},
		{ "compdirty",	"CompDirty"},
		{ "comprblk",	"CompBlock"},
		{ "dirsync",	"DirSync"},
		{ "hashidx",	"HashIndexed"},
		{ "imagic",	"iMagic"},
		{ "journal",	"Journaled"},
		{ "securedeletion",	"SecureDeletion"},
		{ "sync",	"Synchronous"},
		{ "notail",	"NoTail"},
		{ "topdir",	"TopDir"},
		{ "reserved",	"Reserved"},
		{ NULL, NULL}
	};
	const struct flagentry *fe, *flagentry;
#define FLAGENTRY_MAXSIZE ((sizeof(flagbsd)+sizeof(flagext2))/sizeof(flagbsd))
	const struct flagentry *avail[FLAGENTRY_MAXSIZE];
	const char *p;
	int i, n, r;

	if (strcmp(element, "ext2") == 0)
		flagentry = flagext2;
	else
		flagentry = flagbsd;
	n = 0;
	p = fflags_text;
	do {
		const char *cp;

		cp = strchr(p, ',');
		if (cp == NULL)
			cp = p + strlen(p);

		for (fe = flagentry; fe->name != NULL; fe++) {
			if (fe->name[cp - p] != '\0'
			    || p[0] != fe->name[0])
				continue;
			if (strncmp(p, fe->name, cp - p) == 0) {
				avail[n++] = fe;
				break;
			}
		}
		if (*cp == ',')
			p = cp + 1;
		else
			p = NULL;
	} while (p != NULL);

	if (n > 0) {
		r = xml_writer_start_element(writer, element);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
		for (i = 0; i < n; i++) {
			r = xmlwrite_string(a, writer,
			    avail[i]->xarname, NULL);
			if (r != ARCHIVE_OK)
				return (r);
		}

		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}